

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

int Bits::Difference(void *m1,void *m2,int num_bytes)

{
  int local_34;
  byte *pbStack_30;
  int i;
  uint8 *s2;
  uint8 *s1;
  int nbits;
  int num_bytes_local;
  void *m2_local;
  void *m1_local;
  
  s1._0_4_ = 0;
  pbStack_30 = (byte *)m2;
  s2 = (uint8 *)m1;
  for (local_34 = 0; local_34 < num_bytes; local_34 = local_34 + 1) {
    s1._0_4_ = ""[(int)(uint)(*s2 ^ *pbStack_30)] + (int)s1;
    pbStack_30 = pbStack_30 + 1;
    s2 = s2 + 1;
  }
  return (int)s1;
}

Assistant:

int Bits::Difference(const void *m1, const void *m2, int num_bytes) {
  int nbits = 0;
  const uint8 *s1 = (const uint8 *) m1;
  const uint8 *s2 = (const uint8 *) m2;
  for (int i = 0; i < num_bytes; i++)
    nbits += num_bits[(*s1++) ^ (*s2++)];
  return nbits;
}